

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O1

CSipHasher * __thiscall CSipHasher::Write(CSipHasher *this,uint64_t data)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->count;
  if ((bVar1 & 7) != 0) {
    __assert_fail("count % 8 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/siphash.cpp"
                  ,0x20,"CSipHasher &CSipHasher::Write(uint64_t)");
  }
  uVar4 = this->v[1];
  uVar6 = this->v[0] + uVar4;
  uVar3 = this->v[3] ^ data;
  uVar5 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar6;
  uVar7 = this->v[2] + uVar3;
  uVar4 = (uVar3 << 0x10 | uVar3 >> 0x30) ^ uVar7;
  uVar6 = (uVar6 << 0x20 | uVar6 >> 0x20) + uVar4;
  uVar7 = uVar7 + uVar5;
  uVar3 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar7;
  uVar4 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar6;
  uVar6 = uVar6 + uVar3;
  uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar6;
  uVar7 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar4;
  uVar4 = (uVar4 << 0x10 | uVar4 >> 0x30) ^ uVar7;
  uVar5 = (uVar6 << 0x20 | uVar6 >> 0x20) + uVar4;
  uVar7 = uVar7 + uVar3;
  this->v[0] = uVar5 ^ data;
  this->v[1] = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar7;
  this->v[2] = uVar7 << 0x20 | uVar7 >> 0x20;
  this->v[3] = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar5;
  this->count = bVar1 + 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSipHasher& CSipHasher::Write(uint64_t data)
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];

    assert(count % 8 == 0);

    v3 ^= data;
    SIPROUND;
    SIPROUND;
    v0 ^= data;

    v[0] = v0;
    v[1] = v1;
    v[2] = v2;
    v[3] = v3;

    count += 8;
    return *this;
}